

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O3

Float __thiscall
pbrt::TrowbridgeReitzDistribution::PDF(TrowbridgeReitzDistribution *this,Vector3f *wo,Vector3f *wm)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  float fVar8;
  float fVar9;
  Float FVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  
  fVar1 = (wm->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar16 = ZEXT816(0) << 0x40;
  fVar15 = 0.0;
  fVar1 = fVar1 * fVar1;
  auVar13 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar1)),auVar16);
  fVar9 = auVar13._0_4_ / fVar1;
  if ((ABS(fVar9) != INFINITY) && (1e-16 <= fVar1 * fVar1)) {
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    if ((auVar13._0_4_ != 0.0) || (NAN(auVar13._0_4_))) {
      uVar2 = (wm->super_Tuple3<pbrt::Vector3,_float>).x;
      uVar3 = (wm->super_Tuple3<pbrt::Vector3,_float>).y;
      auVar11._4_4_ = uVar3;
      auVar11._0_4_ = uVar2;
      auVar11._8_8_ = 0;
      auVar13._4_4_ = auVar13._0_4_;
      auVar13._8_4_ = auVar13._0_4_;
      auVar13._12_4_ = auVar13._0_4_;
      fVar15 = this->alpha_x;
      auVar13 = vdivps_avx(auVar11,auVar13);
      auVar16._8_4_ = 0x3f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._12_4_ = 0x3f800000;
      uVar4 = vcmpps_avx512vl(auVar13,auVar16,0xe);
      uVar5 = vcmpss_avx512f(auVar13,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar6 = (bool)((byte)uVar5 & 1);
      auVar16 = vmovshdup_avx(auVar13);
      bVar7 = (byte)(uVar4 >> 1);
      fVar12 = (float)((uint)bVar6 * -0x40800000 +
                      (uint)!bVar6 *
                      ((uint)((byte)uVar4 & 1) * 0x3f800000 +
                      (uint)!(bool)((byte)uVar4 & 1) * auVar13._0_4_));
      uVar5 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar6 = (bool)((byte)uVar5 & 1);
      fVar8 = (float)((uint)bVar6 * -0x40800000 +
                     (uint)!bVar6 *
                     ((uint)(bVar7 & 1) * 0x3f800000 + (uint)!(bool)(bVar7 & 1) * auVar16._0_4_));
      fVar12 = (fVar12 * fVar12) / (fVar15 * fVar15);
      auVar16 = ZEXT416((uint)(fVar8 * fVar8));
    }
    else {
      fVar15 = this->alpha_x;
      fVar12 = 1.0 / (fVar15 * fVar15);
    }
    fVar8 = this->alpha_y;
    fVar9 = fVar9 * (fVar12 + auVar16._0_4_ / (fVar8 * fVar8)) + 1.0;
    fVar15 = 1.0 / (fVar1 * fVar1 * fVar15 * 3.1415927 * fVar8 * fVar9 * fVar9);
  }
  FVar10 = Lambda(this,wo);
  auVar14._8_4_ = 0x7fffffff;
  auVar14._0_8_ = 0x7fffffff7fffffff;
  auVar14._12_4_ = 0x7fffffff;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((wo->super_Tuple3<pbrt::Vector3,_float>).y *
                                          (wm->super_Tuple3<pbrt::Vector3,_float>).y)),
                            ZEXT416((uint)(wo->super_Tuple3<pbrt::Vector3,_float>).x),
                            ZEXT416((uint)(wm->super_Tuple3<pbrt::Vector3,_float>).x));
  auVar11 = ZEXT416((uint)(wo->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar16 = vfmadd231ss_fma(auVar13,auVar11,
                            ZEXT416((uint)(wm->super_Tuple3<pbrt::Vector3,_float>).z));
  auVar13 = vandps_avx(auVar11,auVar14);
  auVar16 = vandps_avx(auVar16,auVar14);
  return ((1.0 / (FVar10 + 1.0)) * fVar15 * auVar16._0_4_) / auVar13._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const Vector3f &wo, const Vector3f &wm) const {
        return D(wm) * G1(wo) * AbsDot(wo, wm) / AbsCosTheta(wo);
    }